

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O0

void __thiscall Voxelizer::create_render_pass(Voxelizer *this,shared_ptr<myvk::Device> *device)

{
  shared_ptr<myvk::RenderPass> *in_RDI;
  VkRenderPassCreateInfo render_pass_info;
  VkSubpassDescription subpass;
  shared_ptr<myvk::RenderPass> *in_stack_ffffffffffffff48;
  undefined4 local_98 [5];
  undefined4 local_84;
  undefined8 local_80;
  undefined4 local_78;
  undefined1 *local_70;
  undefined4 local_68;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar1;
  
  memset(&stack0xffffffffffffffa8,0,0x48);
  uVar1 = 0;
  memset(local_98,0,0x40);
  local_98[0] = 0x26;
  local_84 = 0;
  local_80 = 0;
  local_78 = 1;
  local_70 = &stack0xffffffffffffffa8;
  local_68 = 0;
  myvk::RenderPass::Create
            ((Ptr<Device> *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),(VkRenderPassCreateInfo *)0x0)
  ;
  std::shared_ptr<myvk::RenderPass>::operator=(in_RDI,in_stack_ffffffffffffff48);
  std::shared_ptr<myvk::RenderPass>::~shared_ptr((shared_ptr<myvk::RenderPass> *)0x15ba0e);
  return;
}

Assistant:

void Voxelizer::create_render_pass(const std::shared_ptr<myvk::Device> &device) {
	VkSubpassDescription subpass = {};
	subpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
	subpass.colorAttachmentCount = 0;
	subpass.pColorAttachments = nullptr;
	subpass.pDepthStencilAttachment = nullptr;

	VkRenderPassCreateInfo render_pass_info = {};
	render_pass_info.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	render_pass_info.attachmentCount = 0;
	render_pass_info.pAttachments = nullptr;
	render_pass_info.subpassCount = 1;
	render_pass_info.pSubpasses = &subpass;
	render_pass_info.dependencyCount = 0;
	render_pass_info.pDependencies = nullptr;

	m_render_pass = myvk::RenderPass::Create(device, render_pass_info);
}